

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  int iVar2;
  allocator_type *__a;
  uint uVar3;
  uint uVar4;
  initializer_list<long> __l;
  allocator_type local_51;
  vector<long,_std::allocator<long>_> local_50;
  long local_38 [6];
  
  local_38[2] = 3;
  local_38[3] = 4;
  local_38[0] = 1;
  local_38[1] = 2;
  local_38[4] = 5;
  __a = &local_51;
  __l._M_len = 5;
  __l._M_array = local_38;
  std::vector<long,_std::allocator<long>_>::vector(&local_50,__l,__a);
  iVar2 = (int)((ulong)((long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) + -1;
  uVar4 = 0;
  do {
    if (iVar2 < (int)uVar4) {
      uVar4 = ~uVar4;
      goto LAB_001012d7;
    }
    uVar3 = uVar4 + iVar2 >> 1;
    if (local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start[(long)(ulong)uVar3] < 2) {
      uVar4 = uVar3 + 1;
      bVar1 = true;
    }
    else if (local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[(long)(ulong)uVar3] == 2) {
      bVar1 = false;
      __a = (allocator_type *)(ulong)uVar3;
    }
    else {
      iVar2 = uVar3 - 1;
      bVar1 = true;
    }
  } while (bVar1);
  uVar4 = (uint)__a;
LAB_001012d7:
  if (local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return uVar4;
}

Assistant:

int main()
{
  return binarySearch(std::vector<int64_t>{1,2,3,4,5}, 2);
}